

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  byte bVar1;
  pointer pcVar2;
  element_type *peVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t pos;
  string_t result;
  size_t local_58;
  string_t local_50;
  
  throw_if_invalid_utf8(s);
  sVar4 = extra_space(s,ensure_ascii);
  if (sVar4 == 0) {
    peVar3 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*peVar3->_vptr_output_adapter_protocol[1])(peVar3,(s->_M_dataplus)._M_p,s->_M_string_length);
    return;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)sVar4 + (char)s->_M_string_length);
  local_58 = 0;
  uVar5 = s->_M_string_length;
  if (uVar5 != 0) {
    uVar10 = 0;
    do {
      pcVar2 = (s->_M_dataplus)._M_p;
      bVar1 = pcVar2[uVar10];
      uVar8 = (uint)bVar1;
      switch(bVar1) {
      case 8:
        local_50._M_dataplus._M_p[local_58 + 1] = 'b';
        break;
      case 9:
        local_50._M_dataplus._M_p[local_58 + 1] = 't';
        break;
      case 10:
        local_50._M_dataplus._M_p[local_58 + 1] = 'n';
        break;
      case 0xb:
switchD_0013ad39_caseD_b:
        if (0x1f < bVar1 && (bVar1 < 0x7f || !ensure_ascii)) {
          local_50._M_dataplus._M_p[local_58] = bVar1;
          local_58 = local_58 + 1;
          goto LAB_0013add1;
        }
        if ((char)bVar1 < '\0') {
          uVar9 = 1;
          if (((bVar1 & 0xe0) != 0xc0) && (uVar9 = 2, (bVar1 & 0xf0) != 0xe0)) {
            uVar9 = (ulong)((bVar1 & 0xf8) == 0xf0) * 4 - 1;
          }
        }
        else {
          uVar9 = 0;
        }
        if (uVar9 == 0xffffffffffffffff) {
          __assert_fail("bytes != std::string::npos",
                        "/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/json.hpp"
                        ,0x19a2,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        if (uVar5 <= uVar9 + uVar10) {
          __assert_fail("i + bytes < s.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/json.hpp"
                        ,0x19a5,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        if (3 < uVar9) {
          __assert_fail("0 <= bytes and bytes <= 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/json.hpp"
                        ,0x19ab,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        uVar6 = (uint)bVar1;
        switch(uVar9) {
        case 1:
          iVar7 = (uVar6 & 0x3f) << 6;
          uVar8 = (byte)pcVar2[uVar10 + 1] & 0x7f;
          goto LAB_0013ae92;
        case 2:
          iVar7 = (uVar6 & 0x1f) << 0xc;
          uVar8 = ((byte)pcVar2[uVar10 + 2] & 0x7f) + ((byte)pcVar2[uVar10 + 1] & 0x7f) * 0x40;
LAB_0013ae92:
          uVar8 = uVar8 + iVar7;
          break;
        case 3:
          uVar8 = ((byte)pcVar2[uVar10 + 3] & 0x7f) +
                  ((byte)pcVar2[uVar10 + 2] & 0x7f) * 0x40 +
                  ((byte)pcVar2[uVar10 + 1] & 0x7f) * 0x1000 + (uVar6 & 0xf) * 0x40000;
        }
        escape_codepoint(uVar8,&local_50,&local_58);
        uVar10 = uVar9 + uVar10;
        goto LAB_0013add1;
      case 0xc:
        local_50._M_dataplus._M_p[local_58 + 1] = 'f';
        break;
      case 0xd:
        local_50._M_dataplus._M_p[local_58 + 1] = 'r';
        break;
      default:
        if (bVar1 != 0x5c) {
          if (bVar1 != 0x22) goto switchD_0013ad39_caseD_b;
          local_50._M_dataplus._M_p[local_58 + 1] = '\"';
        }
      }
      local_58 = local_58 + 2;
LAB_0013add1:
      uVar10 = uVar10 + 1;
      uVar5 = s->_M_string_length;
    } while (uVar10 < uVar5);
  }
  if (local_58 != local_50._M_string_length) {
    __assert_fail("pos == result.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/json.hpp",
                  0x19dd,
                  "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) const [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  peVar3 = (this->o).
           super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (*peVar3->_vptr_output_adapter_protocol[1])(peVar3,local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii) const
    {
        throw_if_invalid_utf8(s);

        const auto space = extra_space(s, ensure_ascii);
        if (space == 0)
        {
            o->write_characters(s.c_str(), s.size());
            return;
        }

        // create a result string of necessary size
        string_t result(s.size() + space, '\\');
        std::size_t pos = 0;

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            switch (s[i])
            {
                case '"': // quotation mark (0x22)
                {
                    result[pos + 1] = '"';
                    pos += 2;
                    break;
                }

                case '\\': // reverse solidus (0x5C)
                {
                    // nothing to change
                    pos += 2;
                    break;
                }

                case '\b': // backspace (0x08)
                {
                    result[pos + 1] = 'b';
                    pos += 2;
                    break;
                }

                case '\f': // formfeed (0x0C)
                {
                    result[pos + 1] = 'f';
                    pos += 2;
                    break;
                }

                case '\n': // newline (0x0A)
                {
                    result[pos + 1] = 'n';
                    pos += 2;
                    break;
                }

                case '\r': // carriage return (0x0D)
                {
                    result[pos + 1] = 'r';
                    pos += 2;
                    break;
                }

                case '\t': // horizontal tab (0x09)
                {
                    result[pos + 1] = 't';
                    pos += 2;
                    break;
                }

                default:
                {
                    // escape control characters (0x00..0x1F) or, if
                    // ensure_ascii parameter is used, non-ASCII characters
                    if ((0x00 <= s[i] and s[i] <= 0x1F) or
                            (ensure_ascii and (s[i] & 0x80 or s[i] == 0x7F)))
                    {
                        const auto bytes = bytes_following(static_cast<uint8_t>(s[i]));
                        // invalid characters will be detected by throw_if_invalid_utf8
                        assert (bytes != std::string::npos);

                        // check that the additional bytes are present
                        assert(i + bytes < s.size());

                        // to use \uxxxx escaping, we first need to caluclate
                        // the codepoint from the UTF-8 bytes
                        int codepoint = 0;

                        assert(0 <= bytes and bytes <= 3);
                        switch (bytes)
                        {
                            case 0:
                            {
                                codepoint = s[i] & 0xFF;
                                break;
                            }

                            case 1:
                            {
                                codepoint = ((s[i] & 0x3F) << 6)
                                            + (s[i + 1] & 0x7F);
                                break;
                            }

                            case 2:
                            {
                                codepoint = ((s[i] & 0x1F) << 12)
                                            + ((s[i + 1] & 0x7F) << 6)
                                            + (s[i + 2] & 0x7F);
                                break;
                            }

                            case 3:
                            {
                                codepoint = ((s[i] & 0xF) << 18)
                                            + ((s[i + 1] & 0x7F) << 12)
                                            + ((s[i + 2] & 0x7F) << 6)
                                            + (s[i + 3] & 0x7F);
                                break;
                            }

                            default:
                                break;  // LCOV_EXCL_LINE
                        }

                        escape_codepoint(codepoint, result, pos);
                        i += bytes;
                    }
                    else
                    {
                        // all other characters are added as-is
                        result[pos++] = s[i];
                    }
                    break;
                }
            }
        }

        assert(pos == result.size());
        o->write_characters(result.c_str(), result.size());
    }